

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

void test_notify_single_fd_multiple_events(void)

{
  cio_error cVar1;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [2];
  cio_event_notifier ev;
  cio_eventloop loop;
  _func_int_int_int_int_epoll_event_ptr *local_528;
  code *pcStack_520;
  cio_event_notifier local_518;
  cio_eventloop local_4f8;
  
  epoll_ctl_fake.custom_fake_seq = &local_528;
  epoll_wait_fake.custom_fake = notify_single_fd_multiple_events;
  local_528 = epoll_ctl_nosave;
  pcStack_520 = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq_len = 2;
  memset(&local_4f8,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_4f8);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x260,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x261,UNITY_DISPLAY_STYLE_INT);
  local_518.fd = 0x2a;
  local_518.read_callback = epoll_callback;
  local_518.write_callback = epoll_callback;
  local_518.context = &local_4f8;
  cVar1 = cio_linux_eventloop_add(&local_4f8,&local_518);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x26a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (3,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x26b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_4f8.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x26c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x26d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x26e,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_4f8,&local_518);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x271,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x272,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_4f8.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x273,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x274,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x275,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_write(&local_4f8,&local_518);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x278,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (5,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x279,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_4f8.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x27a,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x27b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x27c,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_run(&local_4f8);
  UnityAssertEqualNumber
            (2,(ulong)epoll_callback_fake.call_count,(char *)0x0,0x27f,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_4f8,(UNITY_INT)epoll_callback_fake.arg0_val,(char *)0x0,0x280,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)epoll_callback_fake.arg1_history[0],
             "callback was not called with success code!",0x281,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)epoll_callback_fake.arg1_history[1],
             "callback was not called with success code!",0x282,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_destroy(&local_4f8);
  UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x285,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_notify_single_fd_multiple_events(void)
{
	epoll_wait_fake.custom_fake = notify_single_fd_multiple_events;
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_nosave, epoll_ctl_save};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	static const int fake_fd = 42;
	struct cio_event_notifier ev;
	ev.fd = fake_fd;
	ev.read_callback = epoll_callback;
	ev.write_callback = epoll_callback;
	ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(3, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	err = cio_linux_eventloop_register_read(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	err = cio_linux_eventloop_register_write(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(5, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_run(&loop);
	TEST_ASSERT_EQUAL(2, epoll_callback_fake.call_count);
	TEST_ASSERT_EQUAL(&loop, epoll_callback_fake.arg0_val);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EPOLL_SUCCESS, epoll_callback_fake.arg1_history[0], "callback was not called with success code!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EPOLL_SUCCESS, epoll_callback_fake.arg1_history[1], "callback was not called with success code!");

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}